

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::build_composite_combiner_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t return_type,uint32_t *elems,
          uint32_t length)

{
  uint32_t uVar1;
  Variant *pVVar2;
  bool bVar3;
  bool block_like_type;
  SPIRType *parent_type;
  ulong uVar4;
  SPIRExpression *pSVar5;
  uint32_t base;
  CompilerGLSL *pCVar6;
  ulong uVar7;
  bool bVar8;
  string subop;
  string local_88;
  uint32_t *local_68;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_68 = elems;
  parent_type = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + return_type);
  base = 0;
  if (*(int *)&(parent_type->super_IVariant).field_0xc == 0xf) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    if ((parent_type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      bVar8 = parent_type->columns == 1;
    }
  }
  if (length == 0) {
    bVar3 = false;
  }
  else {
    uVar7 = 0;
    bVar3 = false;
    base = 0;
    local_38 = (ulong)length;
    do {
      uVar4 = (ulong)local_68[uVar7];
      if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
         && (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
            pVVar2[uVar4].type == TypeExpression)) {
        pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar4);
      }
      else {
        pSVar5 = (SPIRExpression *)0x0;
      }
      if ((pSVar5 == (SPIRExpression *)0x0 || !bVar8) ||
         (uVar1 = *(uint32_t *)&(pSVar5->super_IVariant).field_0xc, uVar1 != base || uVar1 == 0)) {
        if (bVar3) {
          if ((this->backend).swizzle_is_function == true) {
            ::std::__cxx11::string::append((char *)&local_88);
          }
          pCVar6 = this;
          bVar3 = remove_duplicate_swizzle(this,&local_88);
          if (!bVar3) {
            pCVar6 = this;
            remove_unity_swizzle(this,base,&local_88);
          }
          strip_enclosed_expression(pCVar6,&local_88);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
          bVar3 = false;
        }
        else {
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
        }
        if (uVar7 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(int *)&(parent_type->super_IVariant).field_0xc == 0xf) {
          block_like_type =
               Compiler::has_member_decoration
                         (&this->super_Compiler,(TypeID)(parent_type->super_IVariant).self.id,
                          (uint32_t)uVar7,DecorationOffset);
        }
        else {
          block_like_type = false;
        }
        to_composite_constructor_expression_abi_cxx11_
                  (&local_60,this,parent_type,local_68[uVar7],block_like_type);
        ::std::__cxx11::string::operator=((string *)&local_88,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      else {
        if (((pSVar5->expression)._M_string_length == 0) ||
           (*(pSVar5->expression)._M_dataplus._M_p != '.')) {
          __assert_fail("!e->expression.empty() && e->expression.front() == \'.\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x2bb7,
                        "string spirv_cross::CompilerGLSL::build_composite_combiner(uint32_t, const uint32_t *, uint32_t)"
                       );
        }
        ::std::__cxx11::string::substr((ulong)&local_60,(ulong)&pSVar5->expression);
        ::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_60._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        bVar3 = true;
      }
      if (pSVar5 == (SPIRExpression *)0x0) {
        base = 0;
      }
      else {
        base = *(uint32_t *)&(pSVar5->super_IVariant).field_0xc;
      }
      uVar7 = uVar7 + 1;
    } while (local_38 != uVar7);
  }
  if (bVar3) {
    if ((this->backend).swizzle_is_function == true) {
      ::std::__cxx11::string::append((char *)&local_88);
    }
    pCVar6 = this;
    bVar8 = remove_duplicate_swizzle(this,&local_88);
    if (!bVar8) {
      remove_unity_swizzle(this,base,&local_88);
      pCVar6 = this;
    }
    strip_enclosed_expression(pCVar6,&local_88);
  }
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::build_composite_combiner(uint32_t return_type, const uint32_t *elems, uint32_t length)
{
	ID base = 0;
	string op;
	string subop;

	// Can only merge swizzles for vectors.
	auto &type = get<SPIRType>(return_type);
	bool can_apply_swizzle_opt = type.basetype != SPIRType::Struct && type.array.empty() && type.columns == 1;
	bool swizzle_optimization = false;

	for (uint32_t i = 0; i < length; i++)
	{
		auto *e = maybe_get<SPIRExpression>(elems[i]);

		// If we're merging another scalar which belongs to the same base
		// object, just merge the swizzles to avoid triggering more than 1 expression read as much as possible!
		if (can_apply_swizzle_opt && e && e->base_expression && e->base_expression == base)
		{
			// Only supposed to be used for vector swizzle -> scalar.
			assert(!e->expression.empty() && e->expression.front() == '.');
			subop += e->expression.substr(1, string::npos);
			swizzle_optimization = true;
		}
		else
		{
			// We'll likely end up with duplicated swizzles, e.g.
			// foobar.xyz.xyz from patterns like
			// OpVectorShuffle
			// OpCompositeExtract x 3
			// OpCompositeConstruct 3x + other scalar.
			// Just modify op in-place.
			if (swizzle_optimization)
			{
				if (backend.swizzle_is_function)
					subop += "()";

				// Don't attempt to remove unity swizzling if we managed to remove duplicate swizzles.
				// The base "foo" might be vec4, while foo.xyz is vec3 (OpVectorShuffle) and looks like a vec3 due to the .xyz tacked on.
				// We only want to remove the swizzles if we're certain that the resulting base will be the same vecsize.
				// Essentially, we can only remove one set of swizzles, since that's what we have control over ...
				// Case 1:
				//  foo.yxz.xyz: Duplicate swizzle kicks in, giving foo.yxz, we are done.
				//               foo.yxz was the result of OpVectorShuffle and we don't know the type of foo.
				// Case 2:
				//  foo.xyz: Duplicate swizzle won't kick in.
				//           If foo is vec3, we can remove xyz, giving just foo.
				if (!remove_duplicate_swizzle(subop))
					remove_unity_swizzle(base, subop);

				// Strips away redundant parens if we created them during component extraction.
				strip_enclosed_expression(subop);
				swizzle_optimization = false;
				op += subop;
			}
			else
				op += subop;

			if (i)
				op += ", ";

			bool uses_buffer_offset =
			    type.basetype == SPIRType::Struct && has_member_decoration(type.self, i, DecorationOffset);
			subop = to_composite_constructor_expression(type, elems[i], uses_buffer_offset);
		}

		base = e ? e->base_expression : ID(0);
	}

	if (swizzle_optimization)
	{
		if (backend.swizzle_is_function)
			subop += "()";

		if (!remove_duplicate_swizzle(subop))
			remove_unity_swizzle(base, subop);
		// Strips away redundant parens if we created them during component extraction.
		strip_enclosed_expression(subop);
	}

	op += subop;
	return op;
}